

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixing(HighsOrbitopeMatrix *this,HighsDomain *domain)

{
  HighsHashTable<int,_int> *this_00;
  int *__args;
  int *piVar1;
  bool bVar2;
  HighsInt HVar3;
  int *piVar4;
  bool bVar5;
  vector<int,_std::allocator<int>_> rows;
  u64 pos;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rowUsed;
  u64 maxPos;
  u64 startPos;
  u8 local_89;
  vector<int,_std::allocator<int>_> local_88;
  HighsOrbitopeMatrix *local_68;
  u64 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  u64 local_40;
  u64 local_38;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,(long)this->numRows,(allocator_type *)&local_60);
  std::vector<int,_std::allocator<int>_>::reserve(&local_88,(long)this->numRows);
  piVar4 = (domain->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (domain->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 == piVar1) {
    bVar5 = true;
  }
  else {
    this_00 = &this->columnToRow;
    bVar5 = true;
    local_68 = this;
    do {
      bVar2 = HighsHashTable<int,_int>::findPosition
                        (this_00,&(domain->domchgstack_).
                                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*piVar4].column,
                         &local_89,&local_38,&local_40,&local_60);
      if (bVar2) {
        __args = (int *)((long)((this_00->entries)._M_t.
                                super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>.
                                _M_head_impl + local_60) + 4);
        if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[*__args] == '\0') {
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[*__args] = '\x01';
          if (bVar5) {
            bVar5 = (local_68->rowIsSetPacking).
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start[*__args] != '\0';
          }
          else {
            bVar5 = false;
          }
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = *__args;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      piVar4 = piVar4 + 1;
      this = local_68;
    } while (piVar4 != piVar1);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    HVar3 = 0;
  }
  else if (bVar5) {
    HVar3 = orbitalFixingForPackingOrbitope(this,&local_88,domain);
  }
  else {
    HVar3 = orbitalFixingForFullOrbitope(this,&local_88,domain);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar3;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixing(HighsDomain& domain) const {
  std::vector<HighsInt> rows;
  std::vector<uint8_t> rowUsed(numRows);

  rows.reserve(numRows);

  const auto& branchpos = domain.getBranchingPositions();
  const auto& domchgstack = domain.getDomainChangeStack();

  bool isPacking = true;
  for (HighsInt pos : branchpos) {
    const HighsInt* i = columnToRow.find(domchgstack[pos].column);
    if (i && !rowUsed[*i]) {
      rowUsed[*i] = true;
      isPacking = isPacking && rowIsSetPacking[*i] != 0;
      rows.push_back(*i);
    }
  }

  if (rows.empty()) return 0;

  if (isPacking) return orbitalFixingForPackingOrbitope(rows, domain);

  return orbitalFixingForFullOrbitope(rows, domain);
}